

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::
basic_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
::~basic_json_encoder
          (basic_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
           *this)

{
  basic_json_encode_options<wchar_t> *in_RDI;
  vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
  *unaff_retaddr;
  
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::flush((string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *)&in_RDI->field_0x8);
  std::__cxx11::wstring::~wstring((wstring *)&in_RDI[1].field_0x108);
  std::__cxx11::wstring::~wstring((wstring *)&in_RDI[1].field_0xe8);
  std::__cxx11::wstring::~wstring((wstring *)&in_RDI[1].field_0xc8);
  std::__cxx11::wstring::~wstring((wstring *)&in_RDI[1].field_0xa8);
  std::__cxx11::wstring::~wstring((wstring *)&in_RDI[1].field_0x88);
  std::__cxx11::wstring::~wstring((wstring *)&in_RDI[1].field_0x68);
  std::
  vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
  ::~vector(unaff_retaddr);
  detail::write_double::~write_double((write_double *)0x9d6bb4);
  basic_json_encode_options<wchar_t>::~basic_json_encode_options(in_RDI);
  basic_json_visitor<wchar_t>::~basic_json_visitor((basic_json_visitor<wchar_t> *)in_RDI);
  return;
}

Assistant:

~basic_json_encoder() noexcept
        {
            JSONCONS_TRY
            {
                sink_.flush();
            }